

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

libcaption_stauts_t sei_to_caption_frame(sei_t *sei,caption_frame_t *frame)

{
  size_t size;
  sei_msgtype_t sVar1;
  sei_message_t *msg_00;
  cea708_t *cea708_00;
  double *in_RSI;
  sei_t *in_RDI;
  libcaption_stauts_t status;
  sei_message_t *msg;
  cea708_t cea708;
  double in_stack_ffffffffffffff38;
  libcaption_stauts_t in_stack_ffffffffffffff40;
  libcaption_stauts_t lVar2;
  cea708_t *in_stack_ffffffffffffff58;
  caption_frame_t *in_stack_ffffffffffffff60;
  
  lVar2 = LIBCAPTION_OK;
  cea708_init((cea708_t *)CONCAT44(1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  for (msg_00 = sei_message_head(in_RDI); msg_00 != (sei_message_t *)0x0;
      msg_00 = sei_message_next(msg_00)) {
    sVar1 = sei_message_type(msg_00);
    if (sVar1 == sei_type_user_data_registered_itu_t_t35) {
      cea708_00 = (cea708_t *)sei_message_data(msg_00);
      sei_message_size(msg_00);
      size = CONCAT44(lVar2,in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff40 = lVar2;
      cea708_parse_h264((uint8_t *)msg_00,size,cea708_00);
      lVar2 = cea708_to_caption_frame(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      lVar2 = libcaption_status_update(in_stack_ffffffffffffff40,lVar2);
    }
  }
  if (lVar2 == LIBCAPTION_READY) {
    *in_RSI = in_RDI->timestamp;
  }
  return lVar2;
}

Assistant:

libcaption_stauts_t sei_to_caption_frame(sei_t* sei, caption_frame_t* frame)
{
    cea708_t cea708;
    sei_message_t* msg;
    libcaption_stauts_t status = LIBCAPTION_OK;

    cea708_init(&cea708, frame->timestamp);

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
            cea708_parse_h264(sei_message_data(msg), sei_message_size(msg), &cea708);
            status = libcaption_status_update(status, cea708_to_caption_frame(frame, &cea708));
        }
    }

    if (LIBCAPTION_READY == status) {
        frame->timestamp = sei->timestamp;
    }

    return status;
}